

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_striped_sse2_128_16.c
# Opt level: O1

parasail_result_t *
parasail_sw_table_striped_profile_sse2_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  ushort *puVar1;
  short *psVar2;
  ulong uVar3;
  uint uVar4;
  void *pvVar5;
  parasail_matrix_t *ppVar6;
  int *piVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  uint uVar13;
  ulong uVar14;
  __m128i *palVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  parasail_result_t *result;
  __m128i *b;
  __m128i *palVar18;
  __m128i *b_00;
  bool bVar19;
  int iVar20;
  undefined4 in_register_0000000c;
  undefined8 uVar21;
  ulong uVar22;
  undefined8 extraout_RDX;
  long lVar23;
  long lVar24;
  ulong size;
  int iVar25;
  ulong uVar26;
  ulong uVar27;
  __m128i *palVar28;
  long lVar29;
  int iVar30;
  __m128i *ptr;
  long lVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined1 auVar34 [16];
  short sVar35;
  short sVar36;
  undefined1 auVar37 [16];
  short sVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  ushort uVar42;
  ushort uVar46;
  ushort uVar47;
  ushort uVar48;
  ushort uVar49;
  ushort uVar50;
  ushort uVar51;
  ushort uVar52;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  short sVar55;
  short sVar56;
  short sVar57;
  short sVar58;
  short sVar59;
  short sVar60;
  short sVar61;
  undefined1 auVar54 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  __m128i c;
  __m128i c_00;
  int32_t column_len;
  undefined4 local_124;
  int local_100;
  __m128i *local_f0;
  size_t len;
  longlong extraout_RDX_00;
  short sVar53;
  
  uVar21 = CONCAT44(in_register_0000000c,open);
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sw_table_striped_profile_sse2_128_16_cold_8();
  }
  else {
    pvVar5 = (profile->profile16).score;
    if (pvVar5 == (void *)0x0) {
      parasail_sw_table_striped_profile_sse2_128_16_cold_7();
    }
    else {
      ppVar6 = profile->matrix;
      if (ppVar6 == (parasail_matrix_t *)0x0) {
        parasail_sw_table_striped_profile_sse2_128_16_cold_6();
      }
      else {
        uVar4 = profile->s1Len;
        if ((int)uVar4 < 1) {
          parasail_sw_table_striped_profile_sse2_128_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_table_striped_profile_sse2_128_16_cold_4();
        }
        else {
          uVar22 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_sw_table_striped_profile_sse2_128_16_cold_3();
          }
          else if (open < 0) {
            parasail_sw_table_striped_profile_sse2_128_16_cold_2();
          }
          else if (gap < 0) {
            parasail_sw_table_striped_profile_sse2_128_16_cold_1();
          }
          else {
            uVar3 = (ulong)uVar4 + 7;
            iVar30 = ppVar6->max;
            result = parasail_result_new_table1((uint)uVar3 & 0x7ffffff8,s2Len);
            if (result != (parasail_result_t *)0x0) {
              size = uVar3 >> 3;
              result->flag = result->flag | 0x8220804;
              b = parasail_memalign___m128i(0x10,size);
              palVar18 = parasail_memalign___m128i(0x10,size);
              local_f0 = parasail_memalign___m128i(0x10,size);
              b_00 = parasail_memalign___m128i(0x10,size);
              c[1]._1_7_ = (undefined7)((ulong)extraout_RDX >> 8);
              bVar19 = palVar18 == (__m128i *)0x0 || b == (__m128i *)0x0;
              len = CONCAT71((int7)((ulong)uVar21 >> 8),bVar19);
              c[1]._0_1_ = (b_00 == (__m128i *)0x0 || local_f0 == (__m128i *)0x0) || bVar19;
              if ((b_00 != (__m128i *)0x0 && local_f0 != (__m128i *)0x0) &&
                  (palVar18 != (__m128i *)0x0 && b != (__m128i *)0x0)) {
                auVar34 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
                uVar32 = auVar34._0_4_;
                auVar34 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
                uVar33 = auVar34._0_4_;
                c[0] = size;
                parasail_memset___m128i(b,c,len);
                c_00[1] = extraout_RDX_00;
                c_00[0] = size;
                parasail_memset___m128i(b_00,c_00,len);
                auVar17 = _DAT_008d0de0;
                auVar34._4_4_ = uVar33;
                auVar34._0_4_ = uVar33;
                auVar34._8_4_ = uVar33;
                auVar34._12_4_ = uVar33;
                auVar16._4_4_ = uVar32;
                auVar16._0_4_ = uVar32;
                auVar16._8_4_ = uVar32;
                auVar16._12_4_ = uVar32;
                uVar27 = 0;
                uVar13 = (uint)size;
                lVar23 = size * uVar22;
                local_124 = 0x8000;
                lVar29 = 0;
                uVar26 = 0;
                auVar63 = _DAT_008d0de0;
                auVar37 = _DAT_008d0de0;
                do {
                  ptr = b;
                  iVar20 = ppVar6->mapper[(byte)s2[uVar26]];
                  local_100 = (int)uVar26;
                  palVar28 = local_f0;
                  b = palVar18;
                  if ((int)uVar27 == local_100 + -2) {
                    palVar28 = palVar18;
                    b = local_f0;
                  }
                  uVar14 = ptr[uVar13 - 1][0];
                  auVar62._0_8_ = uVar14 << 0x10;
                  auVar62._8_8_ = ptr[uVar13 - 1][1] << 0x10 | uVar14 >> 0x30;
                  auVar62 = auVar62 | ZEXT416(0x8000);
                  lVar24 = 0;
                  lVar31 = lVar29;
                  auVar44 = auVar63;
                  auVar39 = auVar17;
                  do {
                    auVar63 = paddsw(auVar62,*(undefined1 (*) [16])
                                              ((long)pvVar5 + lVar24 + size * (long)iVar20 * 0x10));
                    auVar62 = *(undefined1 (*) [16])((long)*b_00 + lVar24);
                    sVar35 = auVar39._0_2_;
                    sVar36 = auVar62._0_2_;
                    uVar42 = (ushort)(sVar36 < sVar35) * sVar35 |
                             (ushort)(sVar36 >= sVar35) * sVar36;
                    sVar35 = auVar39._2_2_;
                    sVar36 = auVar62._2_2_;
                    uVar46 = (ushort)(sVar36 < sVar35) * sVar35 |
                             (ushort)(sVar36 >= sVar35) * sVar36;
                    sVar35 = auVar39._4_2_;
                    sVar36 = auVar62._4_2_;
                    uVar47 = (ushort)(sVar36 < sVar35) * sVar35 |
                             (ushort)(sVar36 >= sVar35) * sVar36;
                    sVar35 = auVar39._6_2_;
                    sVar36 = auVar62._6_2_;
                    uVar48 = (ushort)(sVar36 < sVar35) * sVar35 |
                             (ushort)(sVar36 >= sVar35) * sVar36;
                    sVar35 = auVar39._8_2_;
                    sVar36 = auVar62._8_2_;
                    uVar49 = (ushort)(sVar36 < sVar35) * sVar35 |
                             (ushort)(sVar36 >= sVar35) * sVar36;
                    sVar35 = auVar39._10_2_;
                    sVar36 = auVar62._10_2_;
                    uVar50 = (ushort)(sVar36 < sVar35) * sVar35 |
                             (ushort)(sVar36 >= sVar35) * sVar36;
                    sVar35 = auVar39._12_2_;
                    sVar36 = auVar62._12_2_;
                    sVar53 = auVar62._14_2_;
                    uVar51 = (ushort)(sVar36 < sVar35) * sVar35 |
                             (ushort)(sVar36 >= sVar35) * sVar36;
                    sVar35 = auVar39._14_2_;
                    uVar52 = (ushort)(sVar53 < sVar35) * sVar35 |
                             (ushort)(sVar53 >= sVar35) * sVar53;
                    sVar35 = auVar63._0_2_;
                    auVar43._0_2_ =
                         (ushort)((short)uVar42 < sVar35) * sVar35 |
                         ((short)uVar42 >= sVar35) * uVar42;
                    sVar35 = auVar63._2_2_;
                    auVar43._2_2_ =
                         (ushort)((short)uVar46 < sVar35) * sVar35 |
                         ((short)uVar46 >= sVar35) * uVar46;
                    sVar35 = auVar63._4_2_;
                    auVar43._4_2_ =
                         (ushort)((short)uVar47 < sVar35) * sVar35 |
                         ((short)uVar47 >= sVar35) * uVar47;
                    sVar35 = auVar63._6_2_;
                    auVar43._6_2_ =
                         (ushort)((short)uVar48 < sVar35) * sVar35 |
                         ((short)uVar48 >= sVar35) * uVar48;
                    sVar35 = auVar63._8_2_;
                    auVar43._8_2_ =
                         (ushort)((short)uVar49 < sVar35) * sVar35 |
                         ((short)uVar49 >= sVar35) * uVar49;
                    sVar35 = auVar63._10_2_;
                    auVar43._10_2_ =
                         (ushort)((short)uVar50 < sVar35) * sVar35 |
                         ((short)uVar50 >= sVar35) * uVar50;
                    sVar35 = auVar63._12_2_;
                    auVar43._12_2_ =
                         (ushort)((short)uVar51 < sVar35) * sVar35 |
                         ((short)uVar51 >= sVar35) * uVar51;
                    sVar35 = auVar63._14_2_;
                    auVar43._14_2_ =
                         (ushort)((short)uVar52 < sVar35) * sVar35 |
                         ((short)uVar52 >= sVar35) * uVar52;
                    *(undefined1 (*) [16])((long)*b + lVar24) = auVar43;
                    piVar7 = ((result->field_4).rowcols)->score_row;
                    *(int *)((long)piVar7 + lVar31) = (short)auVar43._0_2_ + 0x8000;
                    *(int *)((long)piVar7 + lVar23 * 4 + lVar31) = (short)auVar43._2_2_ + 0x8000;
                    *(int *)((long)piVar7 + lVar23 * 8 + lVar31) = (short)auVar43._4_2_ + 0x8000;
                    *(int *)((long)piVar7 + lVar23 * 0xc + lVar31) = (short)auVar43._6_2_ + 0x8000;
                    *(int *)((long)piVar7 + lVar23 * 0x10 + lVar31) = (short)auVar43._8_2_ + 0x8000;
                    *(int *)((long)piVar7 + lVar23 * 0x14 + lVar31) = (short)auVar43._10_2_ + 0x8000
                    ;
                    *(int *)((long)piVar7 + lVar23 * 0x18 + lVar31) = (short)auVar43._12_2_ + 0x8000
                    ;
                    *(int *)((long)piVar7 + lVar23 * 0x1c + lVar31) = (short)auVar43._14_2_ + 0x8000
                    ;
                    sVar35 = auVar44._0_2_;
                    auVar63._0_2_ =
                         (sVar35 < (short)auVar43._0_2_) * auVar43._0_2_ |
                         (ushort)(sVar35 >= (short)auVar43._0_2_) * sVar35;
                    sVar35 = auVar44._2_2_;
                    auVar63._2_2_ =
                         (sVar35 < (short)auVar43._2_2_) * auVar43._2_2_ |
                         (ushort)(sVar35 >= (short)auVar43._2_2_) * sVar35;
                    sVar35 = auVar44._4_2_;
                    auVar63._4_2_ =
                         (sVar35 < (short)auVar43._4_2_) * auVar43._4_2_ |
                         (ushort)(sVar35 >= (short)auVar43._4_2_) * sVar35;
                    sVar35 = auVar44._6_2_;
                    auVar63._6_2_ =
                         (sVar35 < (short)auVar43._6_2_) * auVar43._6_2_ |
                         (ushort)(sVar35 >= (short)auVar43._6_2_) * sVar35;
                    sVar35 = auVar44._8_2_;
                    auVar63._8_2_ =
                         (sVar35 < (short)auVar43._8_2_) * auVar43._8_2_ |
                         (ushort)(sVar35 >= (short)auVar43._8_2_) * sVar35;
                    sVar35 = auVar44._10_2_;
                    auVar63._10_2_ =
                         (sVar35 < (short)auVar43._10_2_) * auVar43._10_2_ |
                         (ushort)(sVar35 >= (short)auVar43._10_2_) * sVar35;
                    sVar35 = auVar44._12_2_;
                    sVar36 = auVar44._14_2_;
                    auVar63._12_2_ =
                         (sVar35 < (short)auVar43._12_2_) * auVar43._12_2_ |
                         (ushort)(sVar35 >= (short)auVar43._12_2_) * sVar35;
                    auVar63._14_2_ =
                         (sVar36 < (short)auVar43._14_2_) * auVar43._14_2_ |
                         (ushort)(sVar36 >= (short)auVar43._14_2_) * sVar36;
                    auVar44 = psubsw(auVar43,auVar16);
                    auVar62 = psubsw(auVar62,auVar34);
                    sVar35 = auVar44._0_2_;
                    sVar38 = auVar62._0_2_;
                    sVar36 = auVar44._2_2_;
                    sVar55 = auVar62._2_2_;
                    sVar53 = auVar44._4_2_;
                    sVar56 = auVar62._4_2_;
                    sVar8 = auVar44._6_2_;
                    sVar57 = auVar62._6_2_;
                    sVar9 = auVar44._8_2_;
                    sVar58 = auVar62._8_2_;
                    sVar10 = auVar44._10_2_;
                    sVar59 = auVar62._10_2_;
                    sVar11 = auVar44._12_2_;
                    sVar60 = auVar62._12_2_;
                    sVar61 = auVar62._14_2_;
                    sVar12 = auVar44._14_2_;
                    puVar1 = (ushort *)((long)*b_00 + lVar24);
                    *puVar1 = (ushort)(sVar38 < sVar35) * sVar35 |
                              (ushort)(sVar38 >= sVar35) * sVar38;
                    puVar1[1] = (ushort)(sVar55 < sVar36) * sVar36 |
                                (ushort)(sVar55 >= sVar36) * sVar55;
                    puVar1[2] = (ushort)(sVar56 < sVar53) * sVar53 |
                                (ushort)(sVar56 >= sVar53) * sVar56;
                    puVar1[3] = (ushort)(sVar57 < sVar8) * sVar8 |
                                (ushort)(sVar57 >= sVar8) * sVar57;
                    puVar1[4] = (ushort)(sVar58 < sVar9) * sVar9 |
                                (ushort)(sVar58 >= sVar9) * sVar58;
                    puVar1[5] = (ushort)(sVar59 < sVar10) * sVar10 |
                                (ushort)(sVar59 >= sVar10) * sVar59;
                    puVar1[6] = (ushort)(sVar60 < sVar11) * sVar11 |
                                (ushort)(sVar60 >= sVar11) * sVar60;
                    puVar1[7] = (ushort)(sVar61 < sVar12) * sVar12 |
                                (ushort)(sVar61 >= sVar12) * sVar61;
                    auVar62 = psubsw(auVar39,auVar34);
                    sVar38 = auVar62._0_2_;
                    auVar39._0_2_ =
                         (ushort)(sVar38 < sVar35) * sVar35 | (ushort)(sVar38 >= sVar35) * sVar38;
                    sVar35 = auVar62._2_2_;
                    auVar39._2_2_ =
                         (ushort)(sVar35 < sVar36) * sVar36 | (ushort)(sVar35 >= sVar36) * sVar35;
                    sVar35 = auVar62._4_2_;
                    auVar39._4_2_ =
                         (ushort)(sVar35 < sVar53) * sVar53 | (ushort)(sVar35 >= sVar53) * sVar35;
                    sVar35 = auVar62._6_2_;
                    auVar39._6_2_ =
                         (ushort)(sVar35 < sVar8) * sVar8 | (ushort)(sVar35 >= sVar8) * sVar35;
                    sVar35 = auVar62._8_2_;
                    auVar39._8_2_ =
                         (ushort)(sVar35 < sVar9) * sVar9 | (ushort)(sVar35 >= sVar9) * sVar35;
                    sVar35 = auVar62._10_2_;
                    auVar39._10_2_ =
                         (ushort)(sVar35 < sVar10) * sVar10 | (ushort)(sVar35 >= sVar10) * sVar35;
                    sVar35 = auVar62._12_2_;
                    sVar36 = auVar62._14_2_;
                    auVar39._12_2_ =
                         (ushort)(sVar35 < sVar11) * sVar11 | (ushort)(sVar35 >= sVar11) * sVar35;
                    auVar39._14_2_ =
                         (ushort)(sVar36 < sVar12) * sVar12 | (ushort)(sVar36 >= sVar12) * sVar36;
                    auVar62 = *(undefined1 (*) [16])((long)*ptr + lVar24);
                    lVar24 = lVar24 + 0x10;
                    lVar31 = lVar31 + uVar22 * 4;
                    auVar44 = auVar63;
                  } while (size << 4 != lVar24);
                  iVar20 = 0;
                  do {
                    auVar44._0_8_ = auVar39._0_8_ << 0x10;
                    auVar44._8_8_ = auVar39._8_8_ << 0x10 | auVar39._0_8_ >> 0x30;
                    auVar39 = auVar44 | ZEXT416(0x8000);
                    lVar24 = 0;
                    lVar31 = lVar29;
                    auVar62 = auVar63;
                    do {
                      psVar2 = (short *)((long)*b + lVar24);
                      sVar36 = *psVar2;
                      sVar53 = psVar2[1];
                      sVar8 = psVar2[2];
                      sVar9 = psVar2[3];
                      sVar10 = psVar2[4];
                      sVar11 = psVar2[5];
                      sVar12 = psVar2[6];
                      sVar38 = psVar2[7];
                      sVar35 = auVar39._0_2_;
                      auVar45._0_2_ =
                           (ushort)(sVar36 < sVar35) * sVar35 | (ushort)(sVar36 >= sVar35) * sVar36;
                      sVar35 = auVar39._2_2_;
                      auVar45._2_2_ =
                           (ushort)(sVar53 < sVar35) * sVar35 | (ushort)(sVar53 >= sVar35) * sVar53;
                      sVar35 = auVar39._4_2_;
                      auVar45._4_2_ =
                           (ushort)(sVar8 < sVar35) * sVar35 | (ushort)(sVar8 >= sVar35) * sVar8;
                      sVar35 = auVar39._6_2_;
                      auVar45._6_2_ =
                           (ushort)(sVar9 < sVar35) * sVar35 | (ushort)(sVar9 >= sVar35) * sVar9;
                      sVar35 = auVar39._8_2_;
                      auVar45._8_2_ =
                           (ushort)(sVar10 < sVar35) * sVar35 | (ushort)(sVar10 >= sVar35) * sVar10;
                      sVar35 = auVar39._10_2_;
                      auVar45._10_2_ =
                           (ushort)(sVar11 < sVar35) * sVar35 | (ushort)(sVar11 >= sVar35) * sVar11;
                      sVar35 = auVar39._12_2_;
                      auVar45._12_2_ =
                           (ushort)(sVar12 < sVar35) * sVar35 | (ushort)(sVar12 >= sVar35) * sVar12;
                      sVar35 = auVar39._14_2_;
                      auVar45._14_2_ =
                           (ushort)(sVar38 < sVar35) * sVar35 | (ushort)(sVar38 >= sVar35) * sVar38;
                      *(undefined1 (*) [16])((long)*b + lVar24) = auVar45;
                      piVar7 = ((result->field_4).rowcols)->score_row;
                      *(int *)((long)piVar7 + lVar31) = (short)auVar45._0_2_ + 0x8000;
                      *(int *)((long)piVar7 + lVar23 * 4 + lVar31) = (short)auVar45._2_2_ + 0x8000;
                      *(int *)((long)piVar7 + lVar23 * 8 + lVar31) = (short)auVar45._4_2_ + 0x8000;
                      *(int *)((long)piVar7 + lVar23 * 0xc + lVar31) = (short)auVar45._6_2_ + 0x8000
                      ;
                      *(int *)((long)piVar7 + lVar23 * 0x10 + lVar31) =
                           (short)auVar45._8_2_ + 0x8000;
                      *(int *)((long)piVar7 + lVar23 * 0x14 + lVar31) =
                           (short)auVar45._10_2_ + 0x8000;
                      *(int *)((long)piVar7 + lVar23 * 0x18 + lVar31) =
                           (short)auVar45._12_2_ + 0x8000;
                      *(int *)((long)piVar7 + lVar23 * 0x1c + lVar31) =
                           (short)auVar45._14_2_ + 0x8000;
                      sVar35 = auVar62._0_2_;
                      auVar63._0_2_ =
                           (sVar35 < (short)auVar45._0_2_) * auVar45._0_2_ |
                           (ushort)(sVar35 >= (short)auVar45._0_2_) * sVar35;
                      sVar35 = auVar62._2_2_;
                      auVar63._2_2_ =
                           (sVar35 < (short)auVar45._2_2_) * auVar45._2_2_ |
                           (ushort)(sVar35 >= (short)auVar45._2_2_) * sVar35;
                      sVar35 = auVar62._4_2_;
                      auVar63._4_2_ =
                           (sVar35 < (short)auVar45._4_2_) * auVar45._4_2_ |
                           (ushort)(sVar35 >= (short)auVar45._4_2_) * sVar35;
                      sVar35 = auVar62._6_2_;
                      auVar63._6_2_ =
                           (sVar35 < (short)auVar45._6_2_) * auVar45._6_2_ |
                           (ushort)(sVar35 >= (short)auVar45._6_2_) * sVar35;
                      sVar35 = auVar62._8_2_;
                      auVar63._8_2_ =
                           (sVar35 < (short)auVar45._8_2_) * auVar45._8_2_ |
                           (ushort)(sVar35 >= (short)auVar45._8_2_) * sVar35;
                      sVar35 = auVar62._10_2_;
                      auVar63._10_2_ =
                           (sVar35 < (short)auVar45._10_2_) * auVar45._10_2_ |
                           (ushort)(sVar35 >= (short)auVar45._10_2_) * sVar35;
                      sVar35 = auVar62._12_2_;
                      sVar36 = auVar62._14_2_;
                      auVar63._12_2_ =
                           (sVar35 < (short)auVar45._12_2_) * auVar45._12_2_ |
                           (ushort)(sVar35 >= (short)auVar45._12_2_) * sVar35;
                      auVar63._14_2_ =
                           (sVar36 < (short)auVar45._14_2_) * auVar45._14_2_ |
                           (ushort)(sVar36 >= (short)auVar45._14_2_) * sVar36;
                      auVar62 = psubsw(auVar45,auVar16);
                      auVar39 = psubsw(auVar39,auVar34);
                      auVar54._0_2_ = -(ushort)(auVar62._0_2_ < auVar39._0_2_);
                      auVar54._2_2_ = -(ushort)(auVar62._2_2_ < auVar39._2_2_);
                      auVar54._4_2_ = -(ushort)(auVar62._4_2_ < auVar39._4_2_);
                      auVar54._6_2_ = -(ushort)(auVar62._6_2_ < auVar39._6_2_);
                      auVar54._8_2_ = -(ushort)(auVar62._8_2_ < auVar39._8_2_);
                      auVar54._10_2_ = -(ushort)(auVar62._10_2_ < auVar39._10_2_);
                      auVar54._12_2_ = -(ushort)(auVar62._12_2_ < auVar39._12_2_);
                      auVar54._14_2_ = -(ushort)(auVar62._14_2_ < auVar39._14_2_);
                      if ((((((((((((((((auVar54 >> 7 & (undefined1  [16])0x1) ==
                                        (undefined1  [16])0x0 &&
                                       (auVar54 >> 0xf & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                      (auVar54 >> 0x17 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) &&
                                     (auVar54 >> 0x1f & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar54 >> 0x27 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar54 >> 0x2f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar54 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar54 >> 0x3f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar54 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar54 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar54 >> 0x57 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar54 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar54 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar54 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar54._14_2_ >> 7 & 1) == 0) && (auVar54._14_2_ & 0x8000) == 0)
                      goto LAB_005b79e8;
                      lVar24 = lVar24 + 0x10;
                      lVar31 = lVar31 + uVar22 * 4;
                      auVar62 = auVar63;
                    } while (size << 4 != lVar24);
                    iVar20 = iVar20 + 1;
                  } while (iVar20 != 8);
LAB_005b79e8:
                  auVar40._0_2_ = -(ushort)(auVar37._0_2_ < (short)auVar63._0_2_);
                  auVar40._2_2_ = -(ushort)(auVar37._2_2_ < (short)auVar63._2_2_);
                  auVar40._4_2_ = -(ushort)(auVar37._4_2_ < (short)auVar63._4_2_);
                  auVar40._6_2_ = -(ushort)(auVar37._6_2_ < (short)auVar63._6_2_);
                  auVar40._8_2_ = -(ushort)(auVar37._8_2_ < (short)auVar63._8_2_);
                  auVar40._10_2_ = -(ushort)(auVar37._10_2_ < (short)auVar63._10_2_);
                  auVar40._12_2_ = -(ushort)(auVar37._12_2_ < (short)auVar63._12_2_);
                  auVar40._14_2_ = -(ushort)(auVar37._14_2_ < (short)auVar63._14_2_);
                  bVar19 = true;
                  if ((((((((((((((((auVar40 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                   || (auVar40 >> 0xf & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) ||
                                  (auVar40 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || (auVar40 >> 0x1f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                (auVar40 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar40 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar40 >> 0x37 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                             (auVar40 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar40 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar40 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar40 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar40 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar40 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar40 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar40._14_2_ >> 7 & 1) != 0) || (auVar40._14_2_ & 0x8000) != 0) {
                    uVar42 = ((short)auVar63._8_2_ < (short)auVar63._0_2_) * auVar63._0_2_ |
                             ((short)auVar63._8_2_ >= (short)auVar63._0_2_) * auVar63._8_2_;
                    uVar46 = ((short)auVar63._10_2_ < (short)auVar63._2_2_) * auVar63._2_2_ |
                             ((short)auVar63._10_2_ >= (short)auVar63._2_2_) * auVar63._10_2_;
                    uVar47 = ((short)auVar63._12_2_ < (short)auVar63._4_2_) * auVar63._4_2_ |
                             ((short)auVar63._12_2_ >= (short)auVar63._4_2_) * auVar63._12_2_;
                    uVar48 = ((short)auVar63._14_2_ < (short)auVar63._6_2_) * auVar63._6_2_ |
                             ((short)auVar63._14_2_ >= (short)auVar63._6_2_) * auVar63._14_2_;
                    sVar35 = (0 < (short)auVar63._8_2_) * auVar63._8_2_;
                    sVar36 = (0 < (short)auVar63._10_2_) * auVar63._10_2_;
                    sVar8 = (0 < (short)auVar63._12_2_) * auVar63._12_2_;
                    sVar53 = (0 < (short)auVar63._14_2_) * auVar63._14_2_;
                    uVar42 = ((short)uVar47 < (short)uVar42) * uVar42 |
                             ((short)uVar47 >= (short)uVar42) * uVar47;
                    uVar46 = ((short)uVar48 < (short)uVar46) * uVar46 |
                             ((short)uVar48 >= (short)uVar46) * uVar48;
                    uVar47 = (sVar35 < (short)uVar47) * uVar47 |
                             (ushort)(sVar35 >= (short)uVar47) * sVar35;
                    uVar48 = (sVar36 < (short)uVar48) * uVar48 |
                             (ushort)(sVar36 >= (short)uVar48) * sVar36;
                    uVar49 = (ushort)(sVar8 < sVar35) * sVar35 | (ushort)(sVar8 >= sVar35) * sVar8;
                    uVar50 = (ushort)(sVar53 < sVar36) * sVar36 |
                             (ushort)(sVar53 >= sVar36) * sVar53;
                    sVar8 = (ushort)(0 < sVar8) * sVar8;
                    sVar53 = (ushort)(0 < sVar53) * sVar53;
                    uVar42 = ((short)uVar46 < (short)uVar42) * uVar42 |
                             ((short)uVar46 >= (short)uVar42) * uVar46;
                    auVar41._0_4_ =
                         CONCAT22(((short)uVar47 < (short)uVar46) * uVar46 |
                                  ((short)uVar47 >= (short)uVar46) * uVar47,uVar42);
                    auVar41._4_2_ =
                         ((short)uVar48 < (short)uVar47) * uVar47 |
                         ((short)uVar48 >= (short)uVar47) * uVar48;
                    auVar41._6_2_ =
                         ((short)uVar49 < (short)uVar48) * uVar48 |
                         ((short)uVar49 >= (short)uVar48) * uVar49;
                    auVar41._8_2_ =
                         ((short)uVar50 < (short)uVar49) * uVar49 |
                         ((short)uVar50 >= (short)uVar49) * uVar50;
                    auVar41._10_2_ =
                         (sVar8 < (short)uVar50) * uVar50 | (ushort)(sVar8 >= (short)uVar50) * sVar8
                    ;
                    auVar41._12_2_ =
                         (ushort)(sVar53 < sVar8) * sVar8 | (ushort)(sVar53 >= sVar8) * sVar53;
                    auVar41._14_2_ = (ushort)(0 < sVar53) * sVar53;
                    local_124 = auVar41._0_4_;
                    if ((short)(0x7ffe - (short)iVar30) < (short)uVar42) {
                      *(byte *)&result->flag = (byte)result->flag | 0x40;
                      bVar19 = false;
                    }
                    else {
                      auVar37 = pshuflw(auVar37,auVar41,0);
                      auVar37._4_4_ = auVar37._0_4_;
                      auVar37._8_4_ = auVar37._0_4_;
                      auVar37._12_4_ = auVar37._0_4_;
                      uVar27 = uVar26 & 0xffffffff;
                    }
                  }
                  if (!bVar19) break;
                  uVar26 = uVar26 + 1;
                  lVar29 = lVar29 + 4;
                  palVar18 = ptr;
                  local_f0 = palVar28;
                  local_100 = s2Len;
                } while (uVar26 != uVar22);
                iVar30 = (int)uVar27;
                if ((short)local_124 == 0x7fff) {
                  *(byte *)&result->flag = (byte)result->flag | 0x40;
                }
                iVar20 = parasail_result_is_saturated(result);
                palVar18 = palVar28;
                if (iVar20 == 0) {
                  palVar15 = ptr;
                  if (iVar30 == local_100 + -2) {
                    palVar18 = ptr;
                    palVar15 = palVar28;
                  }
                  if (iVar30 == local_100 + -1) {
                    palVar18 = b;
                    b = palVar28;
                    palVar15 = ptr;
                  }
                  ptr = palVar15;
                  iVar20 = uVar4 - 1;
                  if ((uVar3 & 0x7ffffff8) != 0) {
                    uVar22 = 0;
                    do {
                      if ((*(short *)((long)*palVar18 + uVar22 * 2) == (short)local_124) &&
                         (iVar25 = ((uint)uVar22 & 7) * uVar13 + ((uint)(uVar22 >> 3) & 0x1fffffff),
                         iVar25 < iVar20)) {
                        iVar20 = iVar25;
                      }
                      uVar22 = uVar22 + 1;
                    } while ((uVar13 & 0xfffffff) << 3 != (int)uVar22);
                  }
                  iVar25 = (short)local_124 + 0x8000;
                }
                else {
                  iVar30 = 0;
                  iVar25 = 0xffff;
                  iVar20 = 0;
                }
                result->score = iVar25;
                result->end_query = iVar20;
                result->end_ref = iVar30;
                parasail_free(b_00);
                parasail_free(palVar18);
                parasail_free(ptr);
                parasail_free(b);
                return result;
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvE = NULL;
    __m128i vGapO;
    __m128i vGapE;
    __m128i vZero;
    int16_t bias = 0;
    int16_t score = 0;
    __m128i vBias;
    __m128i vMaxH;
    __m128i vMaxHUnit;
    int16_t maxp = 0;
    __m128i insert_mask;
    /*int16_t stop = 0;*/
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile = (__m128i*)profile->profile16.score;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    vZero = _mm_set1_epi16(0);
    bias = INT16_MIN;
    score = bias;
    vBias = _mm_set1_epi16(bias);
    vMaxH = vBias;
    vMaxHUnit = vBias;
    maxp = INT16_MAX - (int16_t)(matrix->max+1);
    insert_mask = _mm_cmpgt_epi16(
            _mm_set_epi16(0,0,0,0,0,0,0,1),
            vZero);
    /*stop = profile->stop == INT32_MAX ?  INT16_MAX : (int16_t)profile->stop-bias;*/

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad = parasail_memalign___m128i(16, segLen);
    pvHMax = parasail_memalign___m128i(16, segLen);
    pvE = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMax) return NULL;
    if (!pvE) return NULL;

    /* initialize H and E */
    parasail_memset___m128i(pvHStore, vBias, segLen);
    parasail_memset___m128i(pvE, vBias, segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vF;
        __m128i vH;
        const __m128i* vP = NULL;
        __m128i* pv = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        vF = vBias;

        /* load final segment of pvHStore and shift left by 2 bytes */
        vH = _mm_slli_si128(pvHStore[segLen - 1], 2);
        vH = _mm_blendv_epi8_rpl(vH, vBias, insert_mask);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }
        else {
            /* Swap the 2 H buffers. */
            pv = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_adds_epi16(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi16(vH, vE);
            vH = _mm_max_epi16(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len, bias);
#endif
            vMaxH = _mm_max_epi16(vH, vMaxH);

            /* Update vE value. */
            vH = _mm_subs_epi16(vH, vGapO);
            vE = _mm_subs_epi16(vE, vGapE);
            vE = _mm_max_epi16(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            vF = _mm_slli_si128(vF, 2);
            vF = _mm_blendv_epi8_rpl(vF, vBias, insert_mask);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi16(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len, bias);
#endif
                vMaxH = _mm_max_epi16(vH, vMaxH);
                vH = _mm_subs_epi16(vH, vGapO);
                vF = _mm_subs_epi16(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi16(vF, vH))) goto end;
                /*vF = _mm_max_epi16(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7) - bias;
        }
#endif

        {
            __m128i vCompare = _mm_cmpgt_epi16(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi16_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm_set1_epi16(score);
                end_ref = j;
            }
        }

        /*if (score == stop) break;*/
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen, bias);
    }
#endif

    if (score == INT16_MAX) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = INT16_MAX;
        end_query = 0;
        end_ref = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            __m128i *pv = pvHMax;
            pvHMax = pvHStore;
            pvHStore = pv;
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            __m128i *pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pv;
        }
        /* Trace the alignment ending position on read. */
        {
            int16_t *t = (int16_t*)pvHMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len - 1;
            for (i = 0; i<column_len; ++i, ++t) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                    }
                }
            }
        }
    }

    result->score = score - bias;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvE);
    parasail_free(pvHMax);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}